

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

void nni_sock_set_pipe_cb(nni_sock *s,int ev,nng_pipe_cb cb,void *arg)

{
  long lVar1;
  
  if (ev - 1U < 3) {
    nni_mtx_lock(&s->s_pipe_cbs_mtx);
    s->s_pipe_cbs[(uint)ev].cb_fn = cb;
    s->s_pipe_cbs[(uint)ev].cb_arg = arg;
    s->s_want_evs = false;
    lVar1 = 0;
    do {
      if (*(long *)((long)&s->s_pipe_cbs[0].cb_fn + lVar1) != 0) {
        s->s_want_evs = true;
      }
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x40);
    nni_mtx_unlock(&s->s_pipe_cbs_mtx);
    return;
  }
  return;
}

Assistant:

void
nni_sock_set_pipe_cb(nni_sock *s, int ev, nng_pipe_cb cb, void *arg)
{
	if ((ev > NNG_PIPE_EV_NONE) && (ev < NNG_PIPE_EV_NUM)) {
		nni_mtx_lock(&s->s_pipe_cbs_mtx);
		s->s_pipe_cbs[ev].cb_fn  = cb;
		s->s_pipe_cbs[ev].cb_arg = arg;
		s->s_want_evs            = false;
		for (ev = NNG_PIPE_EV_NONE; ev < NNG_PIPE_EV_NUM; ev++) {
			if (s->s_pipe_cbs[ev].cb_fn != NULL) {
				s->s_want_evs = true;
			}
		}
		nni_mtx_unlock(&s->s_pipe_cbs_mtx);
	}
}